

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int ecc_config_get(igsc_device_handle *handle)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint8_t pen_ecc_state;
  uint8_t cur_ecc_state;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cur_ecc_state = 0xff;
  pen_ecc_state = 0xff;
  iVar2 = 3;
  do {
    uVar1 = igsc_ecc_config_get(handle,&cur_ecc_state,&pen_ecc_state);
    if (uVar1 != 0xd) {
      if (uVar1 == 0) {
        if ((quiet == '\0') &&
           (fprintf(_stdout,"Current ECC State: %u\n",(ulong)cur_ecc_state), quiet == '\0')) {
          fprintf(_stdout,"Pending ECC State: %u\n",(ulong)pen_ecc_state);
        }
        goto LAB_0010a9d3;
      }
      break;
    }
    usleep(2000000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (quiet == '\0') {
    fprintf(_stderr,"Error: Failed to get ECC config, return code %d\n",(ulong)uVar1);
  }
  print_device_fw_status(handle);
LAB_0010a9d3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

mockable_static
int ecc_config_get(struct igsc_device_handle *handle)
{
    int     ret;
    uint8_t cur_ecc_state = 0xFF;
    uint8_t pen_ecc_state = 0xFF;
    unsigned int retries = 0;

    while ((ret = igsc_ecc_config_get(handle, &cur_ecc_state, &pen_ecc_state)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret)
    {
        fwupd_error("Failed to get ECC config, return code %d\n", ret);
        print_device_fw_status(handle);
    }
    else
    {
	    fwupd_msg("Current ECC State: %u\n", cur_ecc_state);
	    fwupd_msg("Pending ECC State: %u\n", pen_ecc_state);
    }
    return ret;
}